

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupMarked(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iLit0;
  int iVar3;
  Gia_Man_t *p_00;
  uint *puVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Rpr_t *pGVar7;
  int *piVar8;
  bool bVar9;
  Gia_Obj_t *pSibl;
  Gia_Obj_t *pRepr;
  int CountMarked;
  int nRis;
  int nRos;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  CountMarked = 0;
  pRepr._4_4_ = 0;
  pRepr._0_4_ = 0;
  nRis = 0;
  while( true ) {
    bVar9 = false;
    if (nRis < p->nObjs) {
      _nRos = Gia_ManObj(p,nRis);
      bVar9 = _nRos != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    pRepr._0_4_ = ((uint)(*(ulong *)_nRos >> 0x1e) & 1) + (int)pRepr;
    nRis = nRis + 1;
  }
  Gia_ManFillValue(p);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1 - (int)pRepr);
  if (p->pMuxes != (uint *)0x0) {
    puVar4 = (uint *)calloc((long)p_00->nObjsAlloc,4);
    p_00->pMuxes = puVar4;
  }
  p_00->nConstrs = p->nConstrs;
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = 0;
  nRis = 1;
  while( true ) {
    bVar9 = false;
    if (nRis < p->nObjs) {
      _nRos = Gia_ManObj(p,nRis);
      bVar9 = _nRos != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    if ((*(ulong *)_nRos >> 0x1e & 1) == 0) {
      iVar1 = Gia_ObjIsBuf(_nRos);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(_nRos);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsCi(_nRos);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjIsCo(_nRos);
            if (iVar1 != 0) {
              iVar1 = Gia_ObjFanin0Copy(_nRos);
              uVar2 = Gia_ManAppendCo(p_00,iVar1);
              _nRos->Value = uVar2;
              iVar1 = Gia_ObjIsRi(p,_nRos);
              pRepr._4_4_ = iVar1 + pRepr._4_4_;
            }
          }
          else {
            uVar2 = Gia_ManAppendCi(p_00);
            _nRos->Value = uVar2;
            iVar1 = Gia_ObjIsRo(p,_nRos);
            CountMarked = iVar1 + CountMarked;
          }
        }
        else {
          iVar1 = Gia_ObjIsXor(_nRos);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjIsMux(p,_nRos);
            if (iVar1 == 0) {
              iVar1 = Gia_ObjFanin0Copy(_nRos);
              iVar3 = Gia_ObjFanin1Copy(_nRos);
              uVar2 = Gia_ManAppendAnd(p_00,iVar1,iVar3);
              _nRos->Value = uVar2;
            }
            else {
              iVar1 = Gia_ObjFanin2Copy(p,_nRos);
              iVar3 = Gia_ObjFanin1Copy(_nRos);
              iLit0 = Gia_ObjFanin0Copy(_nRos);
              uVar2 = Gia_ManAppendMuxReal(p_00,iVar1,iVar3,iLit0);
              _nRos->Value = uVar2;
            }
          }
          else {
            iVar1 = Gia_ObjFanin0Copy(_nRos);
            iVar3 = Gia_ObjFanin1Copy(_nRos);
            uVar2 = Gia_ManAppendXorReal(p_00,iVar1,iVar3);
            _nRos->Value = uVar2;
          }
        }
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(_nRos);
        uVar2 = Gia_ManAppendBuf(p_00,iVar1);
        _nRos->Value = uVar2;
      }
    }
    else {
      iVar1 = Gia_ObjIsBuf(_nRos);
      if (iVar1 != 0) {
        __assert_fail("!Gia_ObjIsBuf(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                      ,0x42b,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
      }
      *(ulong *)_nRos = *(ulong *)_nRos & 0xffffffffbfffffff;
    }
    nRis = nRis + 1;
  }
  if (p_00->nObjsAlloc != p_00->nObjs) {
    __assert_fail("pNew->nObjsAlloc == pNew->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x446,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
  }
  if (CountMarked == pRepr._4_4_) {
    Gia_ManSetRegNum(p_00,CountMarked);
    if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
      iVar1 = Gia_ManObjNum(p_00);
      pGVar7 = (Gia_Rpr_t *)calloc((long)iVar1,4);
      p_00->pReprs = pGVar7;
      for (nRis = 0; iVar1 = Gia_ManObjNum(p), nRis < iVar1; nRis = nRis + 1) {
        Gia_ObjSetRepr(p_00,nRis,0xfffffff);
      }
      nRis = 1;
      while( true ) {
        bVar9 = false;
        if (nRis < p->nObjs) {
          _nRos = Gia_ManObj(p,nRis);
          bVar9 = _nRos != (Gia_Obj_t *)0x0;
        }
        if (!bVar9) break;
        if (((_nRos->Value != 0xffffffff) &&
            (pGVar6 = Gia_ObjReprObj(p,nRis), pGVar6 != (Gia_Obj_t *)0x0)) &&
           (pGVar6->Value != 0xffffffff)) {
          iVar1 = Gia_ObjIsBuf(_nRos);
          if (iVar1 != 0) {
            __assert_fail("!Gia_ObjIsBuf(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                          ,0x458,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
          }
          iVar1 = Abc_Lit2Var(_nRos->Value);
          iVar3 = Abc_Lit2Var(pGVar6->Value);
          if (iVar1 != iVar3) {
            iVar1 = Abc_Lit2Var(_nRos->Value);
            iVar3 = Abc_Lit2Var(pGVar6->Value);
            Gia_ObjSetRepr(p_00,iVar1,iVar3);
          }
        }
        nRis = nRis + 1;
      }
      piVar8 = Gia_ManDeriveNexts(p_00);
      p_00->pNexts = piVar8;
    }
    iVar1 = Gia_ManHasChoices(p);
    if (iVar1 != 0) {
      iVar1 = Gia_ManObjNum(p_00);
      piVar8 = (int *)calloc((long)iVar1,4);
      p_00->pSibls = piVar8;
      nRis = 1;
      while( true ) {
        bVar9 = false;
        if (nRis < p->nObjs) {
          _nRos = Gia_ManObj(p,nRis);
          bVar9 = _nRos != (Gia_Obj_t *)0x0;
        }
        if (!bVar9) break;
        if (((_nRos->Value != 0xffffffff) &&
            (pGVar6 = Gia_ObjSiblObj(p,nRis), pGVar6 != (Gia_Obj_t *)0x0)) &&
           (pGVar6->Value != 0xffffffff)) {
          iVar1 = Gia_ObjIsBuf(_nRos);
          if (iVar1 != 0) {
            __assert_fail("!Gia_ObjIsBuf(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                          ,0x46b,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
          }
          iVar1 = Abc_Lit2Var(_nRos->Value);
          iVar3 = Abc_Lit2Var(pGVar6->Value);
          if (iVar1 <= iVar3) {
            __assert_fail("Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pSibl->Value)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                          ,0x46c,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
          }
          iVar1 = Abc_Lit2Var(pGVar6->Value);
          piVar8 = p_00->pSibls;
          iVar3 = Abc_Lit2Var(_nRos->Value);
          piVar8[iVar3] = iVar1;
        }
        nRis = nRis + 1;
      }
    }
    return p_00;
  }
  __assert_fail("nRos == nRis",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                ,0x447,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupMarked( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nRos = 0, nRis = 0;
    int CountMarked = 0;
    Gia_ManForEachObj( p, pObj, i )
        CountMarked += pObj->fMark0;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) - CountMarked );
    if ( p->pMuxes )
        pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    pNew->nConstrs = p->nConstrs;
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( pObj->fMark0 )
        {
            assert( !Gia_ObjIsBuf(pObj) );
            pObj->fMark0 = 0;
            continue;
        }
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            if ( Gia_ObjIsXor(pObj) )
                pObj->Value = Gia_ManAppendXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            else if ( Gia_ObjIsMux(p, pObj) )
                pObj->Value = Gia_ManAppendMuxReal( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
            else
                pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            nRos += Gia_ObjIsRo(p, pObj);
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
//            Gia_Obj_t * pFanin = Gia_ObjFanin0(pObj);
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
            nRis += Gia_ObjIsRi(p, pObj);
        }
    }
    assert( pNew->nObjsAlloc == pNew->nObjs );
    assert( nRos == nRis );
    Gia_ManSetRegNum( pNew, nRos );
    if ( p->pReprs && p->pNexts )
    {
        Gia_Obj_t * pRepr;
        pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pNew) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Gia_ObjSetRepr( pNew, i, GIA_VOID );
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( !~pObj->Value )
                continue;
            pRepr = Gia_ObjReprObj( p, i );
            if ( pRepr == NULL )
                continue;
            if ( !~pRepr->Value )
                continue;
            assert( !Gia_ObjIsBuf(pObj) );
            if ( Abc_Lit2Var(pObj->Value) != Abc_Lit2Var(pRepr->Value) )
                Gia_ObjSetRepr( pNew, Abc_Lit2Var(pObj->Value), Abc_Lit2Var(pRepr->Value) ); 
        }
        pNew->pNexts = Gia_ManDeriveNexts( pNew );
    }
    if ( Gia_ManHasChoices(p) )
    {
        Gia_Obj_t * pSibl;
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(pNew) );
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( !~pObj->Value )
                continue;
            pSibl = Gia_ObjSiblObj( p, i );
            if ( pSibl == NULL )
                continue;
            if ( !~pSibl->Value )
                continue;
            assert( !Gia_ObjIsBuf(pObj) );
            assert( Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pSibl->Value) );
            pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(pSibl->Value);
        }
    }
    return pNew;
}